

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O1

void leopard::VectorXOR(uint64_t bytes,uint count,void **x,void **y)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  if (3 < count) {
    uVar1 = count - 4;
    if (-1 < (int)uVar1) {
      lVar2 = 0;
      do {
        xor_mem4(x[lVar2],y[lVar2],x[lVar2 + 1],y[lVar2 + 1],x[lVar2 + 2],y[lVar2 + 2],x[lVar2 + 3],
                 y[lVar2 + 3],bytes);
        lVar2 = lVar2 + 4;
      } while ((int)lVar2 <= (int)uVar1);
    }
    count = count & 3;
    x = x + (int)(uVar1 & 0xfffffffc);
    y = y + (int)(uVar1 & 0xfffffffc);
  }
  if (count != 0) {
    uVar3 = 0;
    do {
      xor_mem(x[uVar3],y[uVar3],bytes);
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  return;
}

Assistant:

void VectorXOR(
    const uint64_t bytes,
    unsigned count,
    void** x,
    void** y)
{
#ifdef LEO_USE_VECTOR4_OPT
    if (count >= 4)
    {
        int i_end = count - 4;
        for (int i = 0; i <= i_end; i += 4)
        {
            xor_mem4(
                x[i + 0], y[i + 0],
                x[i + 1], y[i + 1],
                x[i + 2], y[i + 2],
                x[i + 3], y[i + 3],
                bytes);
        }
        count %= 4;
        i_end -= count;
        x += i_end;
        y += i_end;
    }
#endif // LEO_USE_VECTOR4_OPT

    for (unsigned i = 0; i < count; ++i)
        xor_mem(x[i], y[i], bytes);
}